

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O3

handle pybind11::detail::
       eigen_array_cast<pybind11::detail::EigenProps<Eigen::Ref<Eigen::Matrix<double,_1,2,1,_1,2>,0,Eigen::OuterStride<_1>>>>
                 (Type *src,handle base,bool writeable)

{
  array aVar1;
  array a;
  allocator_type local_79;
  array local_78;
  StridesContainer local_70;
  ShapeContainer local_58;
  array local_40;
  long local_38 [3];
  undefined8 local_20;
  
  array::array(&local_78);
  local_38[2] = (src->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value;
  local_20 = 2;
  std::vector<long,std::allocator<long>>::vector<long_const*,void>
            ((vector<long,std::allocator<long>> *)&local_58,local_38 + 2,
             (long *)&stack0xffffffffffffffe8,(allocator_type *)local_38);
  local_38[0] = (src->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>_>
                ).m_stride.m_outer.m_value << 3;
  local_38[1] = 8;
  std::vector<long,std::allocator<long>>::vector<long_const*,void>
            ((vector<long,std::allocator<long>> *)&local_70,local_38,local_38 + 2,&local_79);
  array::array<double>
            (&local_40,&local_58,&local_70,
             (src->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data,base);
  object::operator=((object *)&local_78,(object *)&local_40);
  object::~object((object *)&local_40);
  if (local_70.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  aVar1.super_buffer.super_object.super_handle.m_ptr =
       local_78.super_buffer.super_object.super_handle.m_ptr;
  if (!writeable) {
    *(byte *)((long)local_78.super_buffer.super_object.super_handle.m_ptr + 0x41) =
         *(byte *)((long)local_78.super_buffer.super_object.super_handle.m_ptr + 0x41) & 0xfb;
  }
  local_78.super_buffer.super_object.super_handle.m_ptr = (buffer)(object)0x0;
  object::~object((object *)&local_78);
  return (handle)(PyObject *)aVar1.super_buffer.super_object.super_handle.m_ptr;
}

Assistant:

handle eigen_array_cast(typename props::Type const &src, handle base = handle(), bool writeable = true) {
    constexpr ssize_t elem_size = sizeof(typename props::Scalar);
    array a;
    if (props::vector)
        a = array({ src.size() }, { elem_size * src.innerStride() }, src.data(), base);
    else
        a = array({ src.rows(), src.cols() }, { elem_size * src.rowStride(), elem_size * src.colStride() },
                  src.data(), base);

    if (!writeable)
        array_proxy(a.ptr())->flags &= ~detail::npy_api::NPY_ARRAY_WRITEABLE_;

    return a.release();
}